

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

string * toHexString_abi_cxx11_(string *__return_storage_ptr__,uint8_t *pData,size_t size)

{
  ostream *poVar1;
  size_t i;
  size_t sVar2;
  stringstream ss;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
    poVar1 = std::operator<<(local_1a8,0x30);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toHexString(const uint8_t* pData, size_t size)
{
    std::stringstream ss;;
    for (size_t i=0; i<size; i++)
    {
        ss << std::hex << std::setw(2) << std::setfill('0') << unsigned(pData[i]);
    }

    return ss.str();
}